

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR subelems_allocator(lysp_yin_ctx *ctx,size_t count,lysp_node *parent,yin_subelement **result,
                         ...)

{
  char in_AL;
  void *pvVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined4 *local_200;
  undefined8 *local_1e8;
  undefined8 *local_1d0;
  undefined8 *local_1b8;
  undefined8 *local_1a0;
  undefined8 *local_188;
  undefined8 *local_170;
  undefined8 *local_158;
  undefined4 *local_140;
  undefined1 local_128 [32];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 *local_70;
  inout_meta *inout_meta;
  include_meta *inc_meta;
  import_meta *imp_meta;
  tree_node_meta *node_meta;
  size_t i;
  va_list ap;
  yin_subelement **result_local;
  lysp_node *parent_local;
  size_t count_local;
  lysp_yin_ctx *ctx_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_108 = in_R8;
  local_100 = in_R9;
  ap[0].reg_save_area = result;
  pvVar1 = calloc(count,0x18);
  *(void **)ap[0].reg_save_area = pvVar1;
  if (*ap[0].reg_save_area == 0) {
LAB_001d7202:
    subelems_deallocator(count,*ap[0].reg_save_area);
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","subelems_allocator"
          );
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    ap[0].overflow_arg_area = local_128;
    ap[0]._0_8_ = &stack0x00000008;
    i._4_4_ = 0x30;
    i._0_4_ = 0x20;
    for (node_meta = (tree_node_meta *)0x0; node_meta < count;
        node_meta = (tree_node_meta *)((long)&node_meta->parent + 1)) {
      if ((uint)i < 0x29) {
        local_140 = (undefined4 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
        i._0_4_ = (uint)i + 8;
      }
      else {
        local_140 = (undefined4 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      *(undefined4 *)(*ap[0].reg_save_area + (long)node_meta * 0x18) = *local_140;
      if (((((((*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x40) ||
              (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x20)) ||
             (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x1000)) ||
            ((*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x2000 ||
             (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x2f0000)))) ||
           ((*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x8000 ||
            ((*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x4000 ||
             (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 1)))))) ||
          (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x800)) ||
         ((((*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x400 ||
            (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x100)) ||
           (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x200)) ||
          (((*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 8 ||
            (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x10)) ||
           (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x80)))))) {
        imp_meta = (import_meta *)0x0;
        imp_meta = (import_meta *)calloc(1,0x10);
        if (imp_meta == (import_meta *)0x0) goto LAB_001d7202;
        imp_meta->prefix = (char *)parent;
        if ((uint)i < 0x29) {
          local_158 = (undefined8 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
          i._0_4_ = (uint)i + 8;
        }
        else {
          local_158 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        imp_meta->imports = (lysp_import **)*local_158;
        *(import_meta **)(*ap[0].reg_save_area + (long)node_meta * 0x18 + 8) = imp_meta;
      }
      else if (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x140000) {
        inc_meta = (include_meta *)0x0;
        inc_meta = (include_meta *)calloc(1,0x10);
        if (inc_meta == (include_meta *)0x0) goto LAB_001d7202;
        if ((uint)i < 0x29) {
          local_170 = (undefined8 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
          i._0_4_ = (uint)i + 8;
        }
        else {
          local_170 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        inc_meta->name = (char *)*local_170;
        if ((uint)i < 0x29) {
          local_188 = (undefined8 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
          i._0_4_ = (uint)i + 8;
        }
        else {
          local_188 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        inc_meta->includes = (lysp_include **)*local_188;
        *(include_meta **)(*ap[0].reg_save_area + (long)node_meta * 0x18 + 8) = inc_meta;
      }
      else if (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 0x150000) {
        inout_meta = (inout_meta *)0x0;
        inout_meta = (inout_meta *)calloc(1,0x10);
        if (inout_meta == (inout_meta *)0x0) goto LAB_001d7202;
        if ((uint)i < 0x29) {
          local_1a0 = (undefined8 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
          i._0_4_ = (uint)i + 8;
        }
        else {
          local_1a0 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        inout_meta->parent = (lysp_node *)*local_1a0;
        if ((uint)i < 0x29) {
          local_1b8 = (undefined8 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
          i._0_4_ = (uint)i + 8;
        }
        else {
          local_1b8 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        inout_meta->inout_p = (lysp_node_action_inout *)*local_1b8;
        *(inout_meta **)(*ap[0].reg_save_area + (long)node_meta * 0x18 + 8) = inout_meta;
      }
      else if ((*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 2) ||
              (*(int *)(*ap[0].reg_save_area + (long)node_meta * 0x18) == 4)) {
        local_70 = (undefined8 *)0x0;
        local_70 = (undefined8 *)calloc(1,0x10);
        if (local_70 == (undefined8 *)0x0) goto LAB_001d7202;
        *local_70 = parent;
        if ((uint)i < 0x29) {
          local_1d0 = (undefined8 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
          i._0_4_ = (uint)i + 8;
        }
        else {
          local_1d0 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        local_70[1] = *local_1d0;
        *(undefined8 **)(*ap[0].reg_save_area + (long)node_meta * 0x18 + 8) = local_70;
      }
      else {
        if ((uint)i < 0x29) {
          local_1e8 = (undefined8 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
          i._0_4_ = (uint)i + 8;
        }
        else {
          local_1e8 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        *(undefined8 *)(*ap[0].reg_save_area + (long)node_meta * 0x18 + 8) = *local_1e8;
      }
      if ((uint)i < 0x29) {
        local_200 = (undefined4 *)((long)(int)(uint)i + (long)ap[0].overflow_arg_area);
        i._0_4_ = (uint)i + 8;
      }
      else {
        local_200 = (undefined4 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      *(short *)(*ap[0].reg_save_area + (long)node_meta * 0x18 + 0x10) = (short)*local_200;
    }
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
subelems_allocator(struct lysp_yin_ctx *ctx, size_t count, struct lysp_node *parent,
        struct yin_subelement **result, ...)
{
    va_list ap;

    *result = calloc(count, sizeof **result);
    LY_CHECK_GOTO(!(*result), mem_err);

    va_start(ap, result);
    for (size_t i = 0; i < count; ++i) {
        /* TYPE */
        (*result)[i].type = va_arg(ap, enum ly_stmt);
        /* DEST */
        if (IS_NODE_ELEM((*result)[i].type)) {
            struct tree_node_meta *node_meta = NULL;

            node_meta = calloc(1, sizeof *node_meta);
            LY_CHECK_GOTO(!node_meta, mem_err);
            node_meta->parent = parent;
            node_meta->nodes = va_arg(ap, void *);
            (*result)[i].dest = node_meta;
        } else if ((*result)[i].type == LY_STMT_IMPORT) {
            struct import_meta *imp_meta = NULL;

            imp_meta = calloc(1, sizeof *imp_meta);
            LY_CHECK_GOTO(!imp_meta, mem_err);
            imp_meta->prefix = va_arg(ap, const char *);
            imp_meta->imports = va_arg(ap, struct lysp_import **);
            (*result)[i].dest = imp_meta;
        } else if ((*result)[i].type == LY_STMT_INCLUDE) {
            struct include_meta *inc_meta = NULL;

            inc_meta = calloc(1, sizeof *inc_meta);
            LY_CHECK_GOTO(!inc_meta, mem_err);
            inc_meta->name = va_arg(ap, const char *);
            inc_meta->includes = va_arg(ap, struct lysp_include **);
            (*result)[i].dest = inc_meta;
        } else if (((*result)[i].type == LY_STMT_INPUT) || ((*result)[i].type == LY_STMT_OUTPUT)) {
            struct inout_meta *inout_meta = NULL;

            inout_meta = calloc(1, sizeof *inout_meta);
            LY_CHECK_GOTO(!inout_meta, mem_err);
            inout_meta->parent = parent;
            inout_meta->inout_p = va_arg(ap, struct lysp_node_action_inout *);
            (*result)[i].dest = inout_meta;
        } else {
            (*result)[i].dest = va_arg(ap, void *);
        }
        /* FLAGS */
        (*result)[i].flags = va_arg(ap, int);
    }
    va_end(ap);

    return LY_SUCCESS;

mem_err:
    subelems_deallocator(count, *result);
    LOGMEM(ctx->xmlctx->ctx);
    return LY_EMEM;
}